

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRC_Client.cpp
# Opt level: O2

void __thiscall
Jupiter::IRC::Client::Channel::Channel(Channel *this,string_view in_name,Client *in_parent)

{
  size_t sVar1;
  char *pcVar2;
  int iVar3;
  Client *pCVar4;
  size_t sVar5;
  anon_class_8_1_898f2789 read_type;
  string name;
  anon_class_8_1_898f2789 local_60;
  basic_string_view<char,_std::char_traits<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  local_58._M_str = in_name._M_str;
  local_58._M_len = in_name._M_len;
  (this->m_name)._M_dataplus._M_p = (pointer)&(this->m_name).field_2;
  (this->m_name)._M_string_length = 0;
  (this->m_name).field_2._M_local_buf[0] = '\0';
  (this->m_users)._M_h._M_buckets = &(this->m_users)._M_h._M_single_bucket;
  (this->m_users)._M_h._M_bucket_count = 1;
  (this->m_users)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_users)._M_h._M_element_count = 0;
  (this->m_users)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_users)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_users)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
            ((string *)this,&local_58);
  pcVar2 = local_58._M_str;
  sVar1 = local_58._M_len;
  this->m_parent = in_parent;
  this->m_type = in_parent->m_default_chan_type;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  local_48._M_string_length = 0;
  local_48.field_2._M_local_buf[0] = '\0';
  for (sVar5 = 0; sVar1 != sVar5; sVar5 = sVar5 + 1) {
    iVar3 = tolower((int)pcVar2[sVar5]);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (&local_48,(char)iVar3);
  }
  pCVar4 = this->m_parent;
  local_60.name = &local_48;
  if (pCVar4->m_secondary_section != (Config *)0x0) {
    iVar3 = Channel::anon_class_8_1_898f2789::operator()
                      (&local_60,pCVar4->m_secondary_section,this->m_type);
    this->m_type = iVar3;
    pCVar4 = this->m_parent;
  }
  if (pCVar4->m_primary_section != (Config *)0x0) {
    iVar3 = Channel::anon_class_8_1_898f2789::operator()
                      (&local_60,pCVar4->m_primary_section,this->m_type);
    this->m_type = iVar3;
  }
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

Jupiter::IRC::Client::Channel::Channel(std::string_view in_name, Jupiter::IRC::Client *in_parent) {
	// TODO: remove this
	auto to_lower = [&in_name]() {
		std::string result;
		const char *itr = in_name.data();
		const char *end = itr + in_name.size();

		while (itr != end)
		{
			result += static_cast<char>(tolower(*itr));
			++itr;
		}

		return result;
	};

	m_name = in_name;
	m_parent = in_parent;
	m_type = m_parent->getDefaultChanType();

	std::string name = to_lower();

	auto read_type = [&name](Jupiter::Config &in_config, int default_type) {
		return in_config["Channels"sv][name].get<int>("Type"sv, default_type);
	};

	if (m_parent->getSecondaryConfigSection() != nullptr)
		m_type = read_type(*m_parent->getSecondaryConfigSection(), m_type);

	if (m_parent->getPrimaryConfigSection() != nullptr)
		m_type = read_type(*m_parent->getPrimaryConfigSection(), m_type);
}